

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_36::WebSocketPipeImpl::send
          (WebSocketPipeImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  long lVar1;
  bool bVar2;
  undefined8 *puVar3;
  Coroutine<void> *this_00;
  WebSocket *__n_00;
  Promise<void> *promise;
  ulong uVar4;
  Promise<void> *pPVar5;
  size_t sVar6;
  ArrayPtr<const_char> *other;
  suspend_never *this_01;
  long *plVar7;
  PromiseAwaiter<void> *__return_storage_ptr__;
  PromiseAwaiter<void> *__return_storage_ptr___00;
  kj *this_02;
  OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
  *adapterConstructorParams_1;
  suspend_always *this_03;
  SourceLocation *__n_01;
  size_t sVar8;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  int __fd_00;
  undefined4 in_register_00000034;
  int __flags_00;
  WebSocketPipeImpl *this_local;
  ArrayPtr<const_char> message_local;
  
  puVar3 = (undefined8 *)operator_new(0x628);
  *puVar3 = send;
  puVar3[1] = send;
  other = (ArrayPtr<const_char> *)(puVar3 + 0xbc);
  __n_01 = (SourceLocation *)(puVar3 + 0xb9);
  this_01 = (suspend_never *)((long)puVar3 + 0x625);
  plVar7 = puVar3 + 0xbf;
  __return_storage_ptr__ = (PromiseAwaiter<void> *)(puVar3 + 0x47);
  pPVar5 = (Promise<void> *)(puVar3 + 0xc1);
  __return_storage_ptr___00 = (PromiseAwaiter<void> *)(puVar3 + 0x7e);
  this_02 = (kj *)(puVar3 + 0xc2);
  adapterConstructorParams_1 =
       (OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
        *)(puVar3 + 0xb5);
  this_03 = (suspend_always *)((long)puVar3 + 0x626);
  this_00 = (Coroutine<void> *)(puVar3 + 2);
  puVar3[0xc3] = CONCAT44(in_register_00000034,__fd);
  other->ptr = (char *)__buf;
  puVar3[0xbd] = __n;
  __flags_00 = 0x15;
  SourceLocation::SourceLocation
            (__n_01,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,&DAT_00a3c8b6,0xf16);
  kj::_::Coroutine<void>::Coroutine(this_00,*__n_01);
  kj::_::Coroutine<void>::get_return_object((Coroutine<void> *)this);
  kj::_::CoroutineBase::initial_suspend((CoroutineBase *)this_00);
  bVar2 = std::__n4861::suspend_never::await_ready(this_01);
  __fd_00 = (int)puVar3;
  if (bVar2) {
    std::__n4861::suspend_never::await_resume(this_01);
    __n_00 = kj::_::readMaybe<kj::WebSocket>((Maybe<kj::WebSocket_&> *)(puVar3[0xc3] + 0x28));
    *plVar7 = (long)__n_00;
    if (*plVar7 == 0) {
      OneOf<kj::ArrayPtr<char_const>,kj::ArrayPtr<unsigned_char_const>,kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
      ::OneOf<kj::ArrayPtr<char_const>&,int>
                ((OneOf<kj::ArrayPtr<char_const>,kj::ArrayPtr<unsigned_char_const>,kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
                  *)adapterConstructorParams_1,other);
      newAdaptedPromise<void,kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend,kj::(anonymous_namespace)::WebSocketPipeImpl&,kj::OneOf<kj::ArrayPtr<char_const>,kj::ArrayPtr<unsigned_char_const>,kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>>
                (this_02,(WebSocketPipeImpl *)puVar3[0xc3],adapterConstructorParams_1);
      pPVar5 = kj::_::Coroutine<void>::await_transform<kj::Promise<void>>
                         (this_00,(Promise<void> *)this_02);
      co_await<void>(__return_storage_ptr___00,pPVar5);
      bVar2 = kj::_::PromiseAwaiterBase::await_ready
                        ((PromiseAwaiterBase *)__return_storage_ptr___00);
      if (!bVar2) {
        *(undefined1 *)((long)puVar3 + 0x624) = 2;
        uVar4 = _GLOBAL__N_1::WebSocketPipeImpl::send
                          (__return_storage_ptr___00,__fd_00,__buf_02,(size_t)__n_00,__flags_00);
        if ((uVar4 & 1) != 0) {
          return (ssize_t)this;
        }
      }
      kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr___00);
      kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr___00);
      Promise<void>::~Promise((Promise<void> *)this_02);
      OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
      ::~OneOf(adapterConstructorParams_1);
    }
    else {
      puVar3[0xc0] = *plVar7;
      plVar7 = (long *)puVar3[0xc0];
      sVar8 = puVar3[0xbd];
      (**(code **)(*plVar7 + 8))(pPVar5,plVar7,other->ptr);
      promise = kj::_::Coroutine<void>::await_transform<kj::Promise<void>>(this_00,pPVar5);
      co_await<void>(__return_storage_ptr__,promise);
      bVar2 = kj::_::PromiseAwaiterBase::await_ready((PromiseAwaiterBase *)__return_storage_ptr__);
      if (!bVar2) {
        *(undefined1 *)((long)puVar3 + 0x624) = 1;
        uVar4 = _GLOBAL__N_1::WebSocketPipeImpl::send
                          (__return_storage_ptr__,__fd_00,__buf_01,sVar8,__flags_00);
        if ((uVar4 & 1) != 0) {
          return (ssize_t)this;
        }
      }
      kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr__);
      kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr__);
      Promise<void>::~Promise(pPVar5);
    }
    lVar1 = puVar3[0xc3];
    sVar6 = ArrayPtr<const_char>::size(other);
    sVar8 = *(long *)(lVar1 + 0x40) + sVar6;
    *(size_t *)(lVar1 + 0x40) = sVar8;
    kj::_::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
              ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)this_00);
    kj::_::CoroutineBase::final_suspend((CoroutineBase *)this_00);
    bVar2 = std::__n4861::suspend_always::await_ready(this_03);
    if (bVar2) {
      std::__n4861::suspend_always::await_resume(this_03);
      kj::_::Coroutine<void>::~Coroutine(this_00);
      if (puVar3 != (undefined8 *)0x0) {
        operator_delete(puVar3,0x628);
      }
    }
    else {
      *puVar3 = 0;
      *(undefined1 *)((long)puVar3 + 0x624) = 3;
      _GLOBAL__N_1::WebSocketPipeImpl::send(this_03,__fd_00,__buf_03,sVar8,__flags_00);
    }
  }
  else {
    *(undefined1 *)((long)puVar3 + 0x624) = 0;
    _GLOBAL__N_1::WebSocketPipeImpl::send(this_01,__fd_00,__buf_00,(size_t)__n_01,__flags_00);
  }
  return (ssize_t)this;
}

Assistant:

kj::Promise<void> send(kj::ArrayPtr<const char> message) override {
    KJ_IF_SOME(s, state) {
      co_await s.send(message);
    } else {
      co_await newAdaptedPromise<void, BlockedSend>(*this, MessagePtr(message));
    }